

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedArrayStrideTypeAggregateSubCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               string *namePrefix,ProgramInterface interface,DataType type,int expandLevel)

{
  pointer pcVar1;
  DataType type_00;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  ResourceTestCase *this;
  deInt32 *pdVar4;
  SharedPtr variable;
  SharedPtr structMember;
  SharedPtr arrayElement;
  undefined1 local_88 [32];
  SharedPtr local_68;
  SharedPtr local_58;
  TestNode *local_48;
  Context *local_40;
  DataType local_34;
  
  local_48 = &targetGroup->super_TestNode;
  local_40 = context;
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7070;
  *(DataType *)&pNVar2[1]._vptr_Node = type;
  local_88._8_8_ = (SharedPtrStateBase *)0x0;
  local_88._0_8_ = pNVar2;
  local_34 = type;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_88._8_8_ = pSVar3;
  this = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_68,interface,4);
  ResourceTestCase::ResourceTestCase
            (this,local_40,(SharedPtr *)local_88,(ProgramResourceQueryTestTarget *)&local_68,
             (namePrefix->_M_dataplus)._M_p);
  tcu::TestNode::addChild(local_48,(TestNode *)this);
  pdVar4 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    local_88._0_8_ = (Node *)0x0;
    (*(*(_func_int ***)local_88._8_8_)[2])();
  }
  LOCK();
  pdVar4 = (deInt32 *)(local_88._8_8_ + 0xc);
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    if ((SharedPtrStateBase *)local_88._8_8_ != (SharedPtrStateBase *)0x0) {
      (*(*(_func_int ***)local_88._8_8_)[1])();
    }
    local_88._8_8_ = (SharedPtrStateBase *)0x0;
  }
  if (0 < expandLevel) {
    pNVar2 = (Node *)operator_new(0x20);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar3 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a70f8;
    local_68.m_state = (SharedPtrStateBase *)0x0;
    local_68.m_ptr = pNVar2;
    local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_68.m_state)->strongRefCount = 0;
    (local_68.m_state)->weakRefCount = 0;
    (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    (local_68.m_state)->strongRefCount = 1;
    (local_68.m_state)->weakRefCount = 1;
    pNVar2 = (Node *)operator_new(0x28);
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
    pSVar3 = parentStructure->m_state;
    (pNVar2->m_enclosingNode).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7038;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    local_58.m_state = (SharedPtrStateBase *)0x0;
    local_58.m_ptr = pNVar2;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    pNVar2 = (Node *)(local_88 + 0x10);
    pcVar1 = (namePrefix->_M_dataplus)._M_p;
    local_88._0_8_ = pNVar2;
    local_58.m_state = pSVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + namePrefix->_M_string_length);
    std::__cxx11::string::append(local_88);
    type_00 = local_34;
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (local_40,&local_68,(TestCaseGroup *)local_48,(string *)local_88,interface,local_34,0)
    ;
    if ((Node *)local_88._0_8_ != pNVar2) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    pcVar1 = (namePrefix->_M_dataplus)._M_p;
    local_88._0_8_ = pNVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + namePrefix->_M_string_length);
    std::__cxx11::string::append(local_88);
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (local_40,&local_58,(TestCaseGroup *)local_48,(string *)local_88,interface,type_00,0);
    pdVar4 = &pSVar3->strongRefCount;
    if ((Node *)local_88._0_8_ != pNVar2) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    LOCK();
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      local_58.m_ptr = (Node *)0x0;
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar4 = &(local_58.m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      if (local_58.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_58.m_state = (SharedPtrStateBase *)0x0;
    }
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar4 = &(local_68.m_state)->strongRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &(local_68.m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if ((*pdVar4 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
  }
  return;
}

Assistant:

static void generateBufferBackedArrayStrideTypeAggregateSubCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const std::string& namePrefix, ProgramInterface interface, glu::DataType type, int expandLevel)
{
	// case
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, type));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_ARRAY_STRIDE), namePrefix.c_str()));
	}

	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));

		// _struct
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, structMember, targetGroup, namePrefix + "_struct", interface, type, expandLevel - 1);

		// _array
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, arrayElement, targetGroup, namePrefix + "_array", interface, type, expandLevel - 1);
	}
}